

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O3

box3f * __thiscall
pbrt::TriangleMesh::getPrimBounds
          (box3f *__return_storage_ptr__,TriangleMesh *this,size_t primID,affine3f *xfm)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  pointer pvVar18;
  pointer pvVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  float fVar23;
  undefined1 auVar24 [16];
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  float fVar28;
  undefined1 auVar29 [16];
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  
  pvVar18 = (this->vertex).super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar19 = (this->index).super__Vector_base<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>.
            _M_impl.super__Vector_impl_data._M_start;
  fVar28 = pvVar18[pvVar19[primID].x].x;
  fVar1 = (xfm->l).vx.z;
  fVar20 = (xfm->l).vy.z;
  uVar4 = pvVar18[pvVar19[primID].x].y;
  uVar11 = pvVar18[pvVar19[primID].x].z;
  fVar2 = (xfm->l).vz.z;
  fVar21 = (xfm->p).z;
  fVar25 = (float)uVar11 * fVar2 + fVar28 * fVar1 + (float)uVar4 * fVar20 + fVar21;
  fVar30 = fVar25;
  if (3.4028235e+38 <= fVar25) {
    fVar30 = 3.4028235e+38;
  }
  if (fVar25 <= -3.4028235e+38) {
    fVar25 = -3.4028235e+38;
  }
  fVar3 = pvVar18[pvVar19[primID].y].x;
  uVar5 = pvVar18[pvVar19[primID].y].y;
  uVar12 = pvVar18[pvVar19[primID].y].z;
  fVar23 = fVar2 * (float)uVar12 + fVar1 * fVar3 + fVar20 * (float)uVar5 + fVar21;
  fVar26 = fVar23;
  if (fVar30 <= fVar23) {
    fVar26 = fVar30;
  }
  if (fVar23 <= fVar25) {
    fVar23 = fVar25;
  }
  fVar30 = pvVar18[pvVar19[primID].z].x;
  uVar6 = pvVar18[pvVar19[primID].z].y;
  uVar13 = pvVar18[pvVar19[primID].z].z;
  fVar21 = fVar2 * (float)uVar13 + fVar1 * fVar30 + fVar20 * (float)uVar6 + fVar21;
  uVar7 = (xfm->l).vx.x;
  uVar14 = (xfm->l).vx.y;
  uVar8 = (xfm->l).vy.x;
  uVar15 = (xfm->l).vy.y;
  uVar9 = (xfm->l).vz.x;
  uVar16 = (xfm->l).vz.y;
  uVar10 = (xfm->p).x;
  uVar17 = (xfm->p).y;
  auVar22._0_8_ =
       CONCAT44((float)uVar11 * (float)uVar16 +
                (float)uVar4 * (float)uVar15 + fVar28 * (float)uVar14 + (float)uVar17,
                (float)uVar11 * (float)uVar9 + (float)uVar4 * (float)uVar8 + fVar28 * (float)uVar7 +
                (float)uVar10);
  auVar22._8_4_ = (float)uVar11 * 0.0 + (float)uVar4 * 0.0 + fVar28 * 0.0 + 0.0;
  auVar22._12_4_ = (float)uVar11 * 0.0 + (float)uVar4 * 0.0 + fVar28 * 0.0 + 0.0;
  auVar31._8_4_ = auVar22._8_4_;
  auVar31._0_8_ = auVar22._0_8_;
  auVar31._12_4_ = auVar22._12_4_;
  auVar32 = minps(auVar31,_DAT_0014a270);
  auVar24._0_8_ =
       CONCAT44((float)uVar12 * (float)uVar16 + (float)uVar5 * (float)uVar15 + fVar3 * (float)uVar14
                + (float)uVar17,
                (float)uVar12 * (float)uVar9 + (float)uVar5 * (float)uVar8 + fVar3 * (float)uVar7 +
                (float)uVar10);
  auVar24._8_4_ = (float)uVar12 * 0.0 + (float)uVar5 * 0.0 + fVar3 * 0.0 + 0.0;
  auVar24._12_4_ = (float)uVar12 * 0.0 + (float)uVar5 * 0.0 + fVar3 * 0.0 + 0.0;
  auVar29._8_4_ = auVar24._8_4_;
  auVar29._0_8_ = auVar24._0_8_;
  auVar29._12_4_ = auVar24._12_4_;
  auVar29 = minps(auVar29,auVar32);
  auVar32._0_8_ =
       CONCAT44((float)uVar13 * (float)uVar16 +
                (float)uVar6 * (float)uVar15 + fVar30 * (float)uVar14 + (float)uVar17,
                (float)uVar13 * (float)uVar9 + (float)uVar6 * (float)uVar8 + fVar30 * (float)uVar7 +
                (float)uVar10);
  auVar32._8_4_ = (float)uVar13 * 0.0 + (float)uVar6 * 0.0 + fVar30 * 0.0 + 0.0;
  auVar32._12_4_ = (float)uVar13 * 0.0 + (float)uVar6 * 0.0 + fVar30 * 0.0 + 0.0;
  auVar27._8_4_ = auVar32._8_4_;
  auVar27._0_8_ = auVar32._0_8_;
  auVar27._12_4_ = auVar32._12_4_;
  auVar27 = minps(auVar27,auVar29);
  fVar28 = fVar21;
  if (fVar26 <= fVar21) {
    fVar28 = fVar26;
  }
  (__return_storage_ptr__->lower).x = (float)(int)auVar27._0_8_;
  (__return_storage_ptr__->lower).y = (float)(int)((ulong)auVar27._0_8_ >> 0x20);
  (__return_storage_ptr__->lower).z = fVar28;
  auVar22 = maxps(auVar22,_DAT_0014a280);
  auVar22 = maxps(auVar24,auVar22);
  auVar22 = maxps(auVar32,auVar22);
  if (fVar21 <= fVar23) {
    fVar21 = fVar23;
  }
  (__return_storage_ptr__->upper).x = (float)(int)auVar22._0_8_;
  (__return_storage_ptr__->upper).y = (float)(int)((ulong)auVar22._0_8_ >> 0x20);
  (__return_storage_ptr__->upper).z = fVar21;
  return __return_storage_ptr__;
}

Assistant:

box3f TriangleMesh::getPrimBounds(const size_t primID, const affine3f &xfm) 
  {
    box3f primBounds = box3f::empty_box();
    primBounds.extend(xfmPoint(xfm,vertex[index[primID].x]));
    primBounds.extend(xfmPoint(xfm,vertex[index[primID].y]));
    primBounds.extend(xfmPoint(xfm,vertex[index[primID].z]));
    return primBounds;
  }